

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ushort uVar1;
  size_t sVar2;
  size_t sVar3;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ushort uVar4;
  ArrayIndex AVar5;
  runtime_error *this_01;
  char *pcVar6;
  ArrayIndex AVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar8;
  key_type local_68;
  ValueHolder local_58;
  ushort local_50;
  undefined2 uStack_4e;
  undefined8 local_48;
  size_t sStack_40;
  size_t local_38;
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
    uVar4 = (ushort)_local_50 & 0xfe00;
    local_48 = 0;
    sStack_40 = 0;
    local_38 = 0;
    local_50 = uVar4 + 6;
    pcVar6 = (char *)operator_new(0x30);
    pcVar6[0x10] = '\0';
    pcVar6[0x11] = '\0';
    pcVar6[0x12] = '\0';
    pcVar6[0x13] = '\0';
    pcVar6[0x14] = '\0';
    pcVar6[0x15] = '\0';
    pcVar6[0x16] = '\0';
    pcVar6[0x17] = '\0';
    pcVar6[0x18] = '\0';
    pcVar6[0x19] = '\0';
    pcVar6[0x1a] = '\0';
    pcVar6[0x1b] = '\0';
    pcVar6[0x1c] = '\0';
    pcVar6[0x1d] = '\0';
    pcVar6[0x1e] = '\0';
    pcVar6[0x1f] = '\0';
    pcVar6[0x20] = '\0';
    pcVar6[0x21] = '\0';
    pcVar6[0x22] = '\0';
    pcVar6[0x23] = '\0';
    pcVar6[0x24] = '\0';
    pcVar6[0x25] = '\0';
    pcVar6[0x26] = '\0';
    pcVar6[0x27] = '\0';
    pcVar6[0x28] = '\0';
    pcVar6[0x29] = '\0';
    pcVar6[0x2a] = '\0';
    pcVar6[0x2b] = '\0';
    pcVar6[0x2c] = '\0';
    pcVar6[0x2d] = '\0';
    pcVar6[0x2e] = '\0';
    pcVar6[0x2f] = '\0';
    pcVar6[0] = '\0';
    pcVar6[1] = '\0';
    pcVar6[2] = '\0';
    pcVar6[3] = '\0';
    pcVar6[4] = '\0';
    pcVar6[5] = '\0';
    pcVar6[6] = '\0';
    pcVar6[7] = '\0';
    pcVar6[8] = '\0';
    pcVar6[9] = '\0';
    pcVar6[10] = '\0';
    pcVar6[0xb] = '\0';
    pcVar6[0xc] = '\0';
    pcVar6[0xd] = '\0';
    pcVar6[0xe] = '\0';
    pcVar6[0xf] = '\0';
    *(char **)(pcVar6 + 0x18) = pcVar6 + 8;
    *(char **)(pcVar6 + 0x20) = pcVar6 + 8;
    pcVar6[0x28] = '\0';
    pcVar6[0x29] = '\0';
    pcVar6[0x2a] = '\0';
    pcVar6[0x2b] = '\0';
    pcVar6[0x2c] = '\0';
    pcVar6[0x2d] = '\0';
    pcVar6[0x2e] = '\0';
    pcVar6[0x2f] = '\0';
    *(ushort *)&this->field_0x8 = uVar1 & 0xff00 | 6;
    local_58 = this->value_;
    (this->value_).string_ = pcVar6;
    *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 6;
    _local_50 = CONCAT22(uStack_4e,uVar1 & 0x100 | uVar4);
    sVar2 = this->start_;
    this->start_ = sStack_40;
    sVar3 = this->limit_;
    this->limit_ = local_38;
    sStack_40 = sVar2;
    local_38 = sVar3;
    ~Value((Value *)&local_58);
  }
  else if ((char)uVar1 != '\x06') {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"in Json::Value::resize(): requires arrayValue");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  AVar5 = size(this);
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (AVar5 < newSize) {
    operator[](this,newSize - 1);
    return;
  }
  if (newSize < AVar5) {
    AVar7 = newSize;
    do {
      this_00 = &((this->value_).map_)->_M_t;
      local_68.cstr_ = (char *)0x0;
      local_68.index_ = AVar7;
      pVar8 = std::
              _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::equal_range(this_00,&local_68);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(this_00,(_Base_ptr)pVar8.first._M_node,(_Base_ptr)pVar8.second._M_node);
      if ((local_68.cstr_ != (char *)0x0) && (local_68.index_ == 1)) {
        free(local_68.cstr_);
      }
      AVar7 = AVar7 + 1;
    } while (AVar5 != AVar7);
  }
  AVar5 = size(this);
  if (AVar5 == newSize) {
    return;
  }
  __assert_fail("size() == newSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                ,0x345,"void Json::Value::resize(ArrayIndex)");
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
#else
  value_.array_->resize(newSize);
#endif
}